

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_encodeSequences_bmi2
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong *puVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong *puVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong local_b0;
  ulong *local_a0;
  
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar2 = (ushort)*CTable_MatchLength;
  lVar6 = (long)(1 << (uVar2 - 1 & 0x1f));
  if (uVar2 == 0) {
    lVar6 = 1;
  }
  uVar11 = (ulong)mlCodeTable[nbSeq - 1];
  uVar15 = CTable_MatchLength[lVar6 + uVar11 * 2 + 2] + 0x8000;
  uVar8 = (ulong)*(ushort *)
                  ((long)CTable_MatchLength +
                  (long)(int)CTable_MatchLength[lVar6 + uVar11 * 2 + 1] * 2 +
                  (ulong)((uVar15 & 0xffff0000) - CTable_MatchLength[lVar6 + uVar11 * 2 + 2] >>
                         ((ulong)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar17 = (ulong)bVar1;
  uVar3 = (ushort)*CTable_OffsetBits;
  lVar20 = (long)(1 << (uVar3 - 1 & 0x1f));
  if (uVar3 == 0) {
    lVar20 = 1;
  }
  uVar15 = CTable_OffsetBits[lVar20 + uVar17 * 2 + 2] + 0x8000;
  uVar4 = (ushort)*CTable_LitLength;
  lVar22 = (long)(1 << (uVar4 - 1 & 0x1f));
  if (uVar4 == 0) {
    lVar22 = 1;
  }
  local_b0 = (ulong)*(ushort *)
                     ((long)CTable_OffsetBits +
                     (long)(int)CTable_OffsetBits[lVar20 + uVar17 * 2 + 1] * 2 +
                     (ulong)((uVar15 & 0xffff0000) - CTable_OffsetBits[lVar20 + uVar17 * 2 + 2] >>
                            ((ulong)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
  uVar7 = (ulong)llCodeTable[nbSeq - 1];
  uVar15 = CTable_LitLength[lVar22 + uVar7 * 2 + 2] + 0x8000;
  uVar5 = *(ushort *)
           ((long)CTable_LitLength +
           (long)(int)CTable_LitLength[lVar22 + uVar7 * 2 + 1] * 2 +
           (ulong)((uVar15 & 0xffff0000) - CTable_LitLength[lVar22 + uVar7 * 2 + 2] >>
                  ((ulong)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
  uVar15 = LL_bits[uVar7];
  uVar16 = ML_bits[uVar11] + uVar15;
  uVar11 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar11]]) <<
           ((ulong)uVar15 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar15])
  ;
  puVar14 = (ulong *)((long)dst + (dstCapacity - 8));
  if ((longOffsets == 0) || (bVar1 < 0x38)) {
    if (bVar1 < 0x20) {
      uVar15 = uVar16 + bVar1;
      if (0x3f < uVar15) goto LAB_0010e171;
      if (puVar14 < dst) goto LAB_0010e152;
      uVar11 = (ulong)(BIT_mask[uVar17] & sequences[nbSeq - 1].offset) << ((ulong)uVar16 & 0x3f) |
               uVar11;
      *(ulong *)dst = uVar11;
      local_a0 = (ulong *)((ulong)(uVar15 >> 3) + (long)dst);
      if (puVar14 < local_a0) {
        local_a0 = puVar14;
      }
      uVar11 = uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
      uVar15 = uVar15 & 7;
      if (1 < nbSeq) {
        uVar17 = nbSeq - 2;
        do {
          bVar1 = ofCodeTable[uVar17];
          uVar12 = (ulong)bVar1;
          uVar7 = CTable_OffsetBits[lVar20 + uVar12 * 2 + 2] + local_b0;
          if (0x1fffff < uVar7) goto LAB_0010e1ba;
          uVar16 = uVar15 + (int)(uVar7 >> 0x10);
          if (0x3f < uVar16) goto LAB_0010e171;
          uVar21 = (ulong)mlCodeTable[uVar17];
          uVar23 = CTable_MatchLength[lVar6 + uVar21 * 2 + 2] + uVar8;
          if (0x1fffff < uVar23) goto LAB_0010e1ba;
          uVar13 = uVar16 + (int)(uVar23 >> 0x10);
          if (0x3f < uVar13) goto LAB_0010e171;
          uVar24 = (ulong)llCodeTable[uVar17];
          uVar26 = (ulong)CTable_LitLength[lVar22 + uVar24 * 2 + 2] + (ulong)uVar5;
          if (0x1fffff < uVar26) goto LAB_0010e1ba;
          uVar10 = uVar13 + (int)(uVar26 >> 0x10);
          if (0x3f < uVar10) goto LAB_0010e171;
          uVar18 = (uint)local_b0;
          local_b0 = (ulong)*(ushort *)
                             ((long)CTable_OffsetBits +
                             (long)(int)CTable_OffsetBits[lVar20 + uVar12 * 2 + 1] * 2 +
                             (local_b0 >> (uVar7 >> 0x10 & 0x3f)) * 2 + 4);
          uVar25 = (uint)uVar8;
          uVar8 = (ulong)*(ushort *)
                          ((long)CTable_MatchLength +
                          (long)(int)CTable_MatchLength[lVar6 + uVar21 * 2 + 1] * 2 +
                          (uVar8 >> (uVar23 >> 0x10 & 0x3f)) * 2 + 4);
          uVar11 = (ulong)(BIT_mask[uVar26 >> 0x10] & (uint)uVar5) << ((ulong)uVar13 & 0x3f) |
                   (ulong)(BIT_mask[uVar23 >> 0x10] & uVar25) << ((ulong)uVar16 & 0x3f) |
                   (ulong)(BIT_mask[uVar7 >> 0x10] & uVar18) << uVar15 | uVar11;
          uVar15 = LL_bits[uVar24];
          uVar16 = ML_bits[uVar21];
          uVar5 = *(ushort *)
                   ((long)CTable_LitLength +
                   (long)(int)CTable_LitLength[lVar22 + uVar24 * 2 + 1] * 2 +
                   (ulong)(uVar5 >> (uVar26 >> 0x10 & 0x3f)) * 2 + 4);
          uVar13 = bVar1 + uVar15 + uVar16;
          if (0x1e < uVar13) {
            puVar19 = (ulong *)((ulong)(uVar10 >> 3) + (long)local_a0);
            if (puVar14 < puVar19) {
              puVar19 = puVar14;
            }
            *local_a0 = uVar11;
            uVar11 = uVar11 >> ((ulong)((byte)uVar10 & 0xf8) & 0x3f);
            local_a0 = puVar19;
            uVar10 = uVar10 & 7;
          }
          uVar25 = uVar15 + uVar10;
          if ((0x3f < uVar25) || (uVar18 = uVar25 + uVar16, 0x3f < uVar18)) goto LAB_0010e171;
          uVar11 = (ulong)((uint)sequences[uVar17].matchLength & BIT_mask[uVar16]) <<
                   ((ulong)uVar25 & 0x3f) |
                   (ulong)((uint)sequences[uVar17].litLength & BIT_mask[uVar15]) <<
                   ((ulong)uVar10 & 0x3f) | uVar11;
          puVar19 = local_a0;
          uVar16 = uVar18;
          if (0x38 < uVar13) {
            puVar19 = (ulong *)((ulong)(uVar18 >> 3) + (long)local_a0);
            if (puVar14 < puVar19) {
              puVar19 = puVar14;
            }
            *local_a0 = uVar11;
            uVar16 = uVar18 & 7;
            uVar11 = uVar11 >> ((ulong)((byte)uVar18 & 0xf8) & 0x3f);
          }
          uVar15 = (uint)bVar1;
          if ((longOffsets != 0) && (0x37 < bVar1)) {
            if ((uVar15 == 0x38) || (uVar15 = uVar15 - 0x38, 0x1f < uVar15)) goto LAB_0010e1ba;
            if (0x3f < uVar16 + uVar15) goto LAB_0010e171;
            *puVar19 = (ulong)(sequences[uVar17].offset & BIT_mask[uVar15]) <<
                       ((ulong)uVar16 & 0x3f) | uVar11;
            goto LAB_0010e1ba;
          }
          if (0x1f < bVar1) goto LAB_0010e1ba;
          uVar15 = uVar16 + uVar15;
          if (0x3f < uVar15) goto LAB_0010e171;
          uVar11 = (ulong)(BIT_mask[uVar12] & sequences[uVar17].offset) << ((ulong)uVar16 & 0x3f) |
                   uVar11;
          local_a0 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar19);
          if (puVar14 < local_a0) {
            local_a0 = puVar14;
          }
          *puVar19 = uVar11;
          uVar11 = uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
          uVar17 = uVar17 - 1;
          uVar15 = uVar15 & 7;
        } while (uVar17 < nbSeq);
      }
      if (uVar2 < 0x20) {
        uVar11 = (ulong)((uint)uVar8 & BIT_mask[uVar2]) << uVar15 | uVar11;
        *local_a0 = uVar11;
        if (uVar3 < 0x20) {
          uVar15 = uVar15 + uVar2;
          local_a0 = (ulong *)((long)local_a0 + (ulong)(uVar15 >> 3));
          if (puVar14 < local_a0) {
            local_a0 = puVar14;
          }
          uVar8 = (ulong)((uint)local_b0 & BIT_mask[uVar3]) << (uVar15 & 7) |
                  uVar11 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
          *local_a0 = uVar8;
          if (uVar4 < 0x20) {
            uVar15 = (uVar15 & 7) + (uint)uVar3;
            local_a0 = (ulong *)((long)local_a0 + (ulong)(uVar15 >> 3));
            if (puVar14 < local_a0) {
              local_a0 = puVar14;
            }
            uVar16 = (uVar15 & 7) + (uint)uVar4;
            uVar8 = (ulong)((uint)uVar5 & BIT_mask[uVar4]) << (uVar15 & 7) |
                    uVar8 >> ((ulong)((byte)uVar15 & 0xf8) & 0x3f);
            puVar19 = (ulong *)((ulong)(uVar16 >> 3) + (long)local_a0);
            if (puVar14 < puVar19) {
              puVar19 = puVar14;
            }
            *local_a0 = uVar8;
            uVar15 = (uVar16 & 7) + 1;
            *puVar19 = uVar8 >> ((ulong)((byte)uVar16 & 0xf8) & 0x3f) | 1L << (uVar16 & 7);
            puVar19 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar19);
            if (puVar14 < puVar19) {
              puVar19 = puVar14;
            }
            if ((puVar19 < puVar14) &&
               (sVar9 = (long)puVar19 + ((ulong)((uVar15 & 7) != 0) - (long)dst), sVar9 != 0)) {
              return sVar9;
            }
            return 0xffffffffffffffba;
          }
        }
      }
    }
  }
  else if ((bVar1 != 0x38) && (uVar15 = bVar1 - 0x38, uVar15 < 0x20)) {
    if (0x3f < uVar16 + uVar15) {
LAB_0010e171:
      __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5df,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
    }
    if (puVar14 < dst) {
LAB_0010e152:
      __assert_fail("bitC->ptr <= bitC->endPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
    }
    *(ulong *)dst =
         (ulong)(sequences[nbSeq - 1].offset & BIT_mask[uVar15]) << ((ulong)uVar16 & 0x3f) | uVar11;
  }
LAB_0010e1ba:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5de,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

size_t
ZSTD_encodeSequences_bmi2(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets)
{
    return ZSTD_encodeSequences_body(dst, dstCapacity,
                                    CTable_MatchLength, mlCodeTable,
                                    CTable_OffsetBits, ofCodeTable,
                                    CTable_LitLength, llCodeTable,
                                    sequences, nbSeq, longOffsets);
}